

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoaderU.h
# Opt level: O1

void __thiscall
chrono::ChLoaderUatomic::ComputeQ
          (ChLoaderUatomic *this,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  ChVectorDynamic<> *this_00;
  element_type *peVar1;
  long lVar2;
  int iVar3;
  ActualDstType actualDst_1;
  ActualDstType actualDst;
  ChVectorDynamic<> mF;
  double detJ;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_38;
  undefined1 local_28 [8];
  
  this_00 = &(this->super_ChLoaderU).super_ChLoader.Q;
  peVar1 = (this->super_ChLoaderU).loadable.
           super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar3 = (**(code **)(*(long *)(peVar1 + *(long *)(*(long *)peVar1 + -0x78)) + 0x18))
                    (peVar1 + *(long *)(*(long *)peVar1 + -0x78));
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar3);
  lVar2 = (this->super_ChLoaderU).super_ChLoader.Q.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (-1 < lVar2) {
    if (lVar2 != 0) {
      memset((this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data,0,lVar2 << 3);
    }
    peVar1 = (this->super_ChLoaderU).loadable.
             super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar3 = (**(code **)(*(long *)(peVar1 + *(long *)(*(long *)peVar1 + -0x78)) + 0x38))
                      (peVar1 + *(long *)(*(long *)peVar1 + -0x78));
    local_38.m_storage.m_data = (double *)0x0;
    local_38.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_38,(long)iVar3);
    if (-1 < local_38.m_storage.m_rows) {
      if (local_38.m_storage.m_rows != 0) {
        memset(local_38.m_storage.m_data,0,local_38.m_storage.m_rows << 3);
      }
      (*(this->super_ChLoaderU).super_ChLoader._vptr_ChLoader[5])
                (this->Pu,this,&local_38,state_x,state_w);
      peVar1 = (this->super_ChLoaderU).loadable.
               super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (**(code **)(*(long *)peVar1 + 0x68))
                (this->Pu,peVar1,this_00,local_28,&local_38,state_x,state_w);
      if (local_38.m_storage.m_data != (double *)0x0) {
        free((void *)local_38.m_storage.m_data[-1]);
      }
      return;
    }
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

virtual void ComputeQ(ChVectorDynamic<>* state_x,  ///< if != 0, update state (pos. part) to this, then evaluate Q
                          ChVectorDynamic<>* state_w   ///< if != 0, update state (speed part) to this, then evaluate Q
                          ) override {
        Q.setZero(loadable->LoadableGet_ndof_w());
        ChVectorDynamic<> mF(loadable->Get_field_ncoords());
        mF.setZero();

        // Compute F=F(u)
        this->ComputeF(Pu, mF, state_x, state_w);

        // Compute N(u)'*F
        double detJ;
        loadable->ComputeNF(Pu, Q, detJ, mF, state_x, state_w);
    }